

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osdtext.cpp
# Opt level: O0

int __thiscall
CGL::OSDText::add_line(OSDText *this,float x,float y,string *text,size_t size,Color color)

{
  undefined4 uVar1;
  undefined1 auStack_98 [8];
  OSDLine new_line;
  size_t size_local;
  string *text_local;
  float y_local;
  float x_local;
  OSDText *this_local;
  Color color_local;
  
  new_line.text.field_2._8_8_ = 0;
  new_line.size = 0;
  new_line.text._M_string_length = 0;
  new_line.text.field_2._M_allocated_capacity = 0;
  new_line.y = 0.0;
  new_line._12_4_ = 0;
  new_line.text._M_dataplus = (_Alloc_hider)0x0;
  new_line.text._1_7_ = 0;
  auStack_98._0_4_ = 0;
  auStack_98._4_4_ = 0.0;
  new_line.id = 0;
  new_line.x = 0.0;
  new_line.color.r = 0.0;
  new_line.color.g = 0.0;
  OSDLine::OSDLine((OSDLine *)auStack_98);
  new_line.id = (int)y;
  auStack_98._4_4_ = x;
  std::__cxx11::string::operator=((string *)&new_line.y,(string *)text);
  new_line.color.r = color.b;
  new_line.text.field_2._8_8_ = size;
  if ((this->use_hdpi & 1U) != 0) {
    new_line.text.field_2._8_8_ = size << 1;
  }
  auStack_98._0_4_ = this->next_id;
  this->next_id = this->next_id + 1;
  new_line.size = color._0_8_;
  std::vector<CGL::OSDLine,_std::allocator<CGL::OSDLine>_>::push_back
            (&this->lines,(value_type *)auStack_98);
  uVar1 = auStack_98._0_4_;
  OSDLine::~OSDLine((OSDLine *)auStack_98);
  return uVar1;
}

Assistant:

int OSDText::add_line(float x, float y, string text,
                      size_t size, Color color) {
  // create new line
  OSDLine new_line = OSDLine();
  new_line.x = x;
  new_line.y = y;
  new_line.text = text;
  new_line.size = size;
  new_line.color = color;

  // handle HDPI display
  if (use_hdpi) new_line.size *= 2;

  // update id
  new_line.id = next_id;
  next_id++;

  // add line
  lines.push_back(new_line);

  return new_line.id;
}